

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Formatter_inl.hpp
# Opt level: O1

string * __thiscall
CLI::Formatter::make_option_abi_cxx11_
          (string *__return_storage_ptr__,Formatter *this,Option *opt,bool is_positional)

{
  size_type *psVar1;
  ulong uVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  size_t sVar4;
  size_type sVar5;
  long *plVar6;
  undefined8 *puVar7;
  undefined7 in_register_00000009;
  ulong *puVar8;
  string *delim;
  int iVar9;
  undefined8 uVar10;
  int iVar11;
  float fVar12;
  anon_class_16_2_577437cb __f;
  string desc;
  string shortNames;
  string left;
  string desc_1;
  string longNames;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vlongNames;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vshortNames;
  stringstream out;
  string local_318;
  string local_2f8;
  string local_2d8;
  string *local_2b8;
  string local_2b0;
  string local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_250;
  string local_238;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_218;
  undefined1 local_1f8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  undefined1 local_1c8 [16];
  stringstream local_1b8 [16];
  long local_1a8 [2];
  long lStack_198;
  uint auStack_190 [22];
  ios_base local_138 [264];
  
  ::std::__cxx11::stringstream::stringstream((stringstream *)(local_1c8 + 0x10));
  if ((int)CONCAT71(in_register_00000009,is_positional) == 0) {
    (*(this->super_FormatterBase)._vptr_FormatterBase[0xc])(&local_2d8,this,opt,0);
    (*(this->super_FormatterBase)._vptr_FormatterBase[0xd])(&local_318,this,opt);
    (*(this->super_FormatterBase)._vptr_FormatterBase[0xe])(&local_2b0,this,opt);
    detail::split(&local_250,&local_2d8,',');
    local_218.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_218.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_218.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    delim = &local_238;
    local_238.field_2._M_allocated_capacity = 0;
    local_238._M_dataplus._M_p = (pointer)0x0;
    local_238._M_string_length = 0;
    __f.vlongNames =
         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)delim;
    __f.vshortNames = &local_218;
    ::std::
    for_each<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,CLI::Formatter::make_option(CLI::Option_const*,bool)const::_lambda(std::__cxx11::string_const&)_1_>
              ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )local_250.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )local_250.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,__f);
    local_1d8._M_allocated_capacity = (size_type)local_1c8;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,", ","");
    detail::join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&local_2f8,(detail *)&local_218,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_1d8,delim);
    if ((undefined1 *)local_1d8._M_allocated_capacity != local_1c8) {
      operator_delete((void *)local_1d8._M_allocated_capacity);
    }
    local_1f8._0_8_ = (pointer)(local_1f8 + 0x10);
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,", ","");
    detail::join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&local_290,(detail *)&local_238,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_1f8,delim);
    if ((pointer)local_1f8._0_8_ != (pointer)(local_1f8 + 0x10)) {
      operator_delete((void *)local_1f8._0_8_);
    }
    uVar2 = (this->super_FormatterBase).column_width_;
    fVar12 = (float)uVar2 / 3.0;
    fVar12 = ceilf(fVar12 + fVar12);
    local_2b8 = (string *)CONCAT44(local_2b8._4_4_,fVar12);
    iVar9 = (int)(uVar2 / 3);
    if (CONCAT44(local_2f8._M_string_length._4_4_,(int)local_2f8._M_string_length) == 0) {
      *(long *)((long)&lStack_198 + *(long *)(local_1a8[0] + -0x18)) = (long)iVar9;
      *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
           *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffff4f | 0x20;
      iVar11 = 0;
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"",0);
    }
    else {
      ::std::operator+(&local_270,"  ",&local_2f8);
      ::std::__cxx11::string::operator=((string *)&local_2f8,(string *)&local_270);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
        operator_delete(local_270._M_dataplus._M_p);
      }
      if ((CONCAT44(local_290._M_string_length._4_4_,(int)local_290._M_string_length) == 0) &&
         (local_318._M_string_length != 0)) {
        ::std::__cxx11::string::_M_append((char *)&local_2f8,(ulong)local_318._M_dataplus._M_p);
      }
      if (CONCAT44(local_290._M_string_length._4_4_,(int)local_290._M_string_length) != 0) {
        ::std::__cxx11::string::append((char *)&local_2f8);
      }
      iVar11 = 0;
      if (iVar9 <= (int)local_2f8._M_string_length) {
        ::std::__cxx11::string::append((char *)&local_2f8);
        iVar11 = (int)local_2f8._M_string_length - iVar9;
      }
      *(long *)((long)&lStack_198 + *(long *)(local_1a8[0] + -0x18)) = (long)iVar9;
      *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
           *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffff4f | 0x20;
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,local_2f8._M_dataplus._M_p,
                 CONCAT44(local_2f8._M_string_length._4_4_,(int)local_2f8._M_string_length));
    }
    iVar9 = (int)local_2b8._0_4_;
    if (iVar9 <= iVar11) {
      iVar11 = iVar9;
    }
    iVar9 = iVar9 - iVar11;
    if (CONCAT44(local_290._M_string_length._4_4_,(int)local_290._M_string_length) == 0) {
      *(long *)((long)&lStack_198 + *(long *)(local_1a8[0] + -0x18)) = (long)iVar9;
      *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
           *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffff4f | 0x20;
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"",0);
    }
    else {
      if (local_318._M_string_length != 0) {
        ::std::__cxx11::string::_M_append((char *)&local_290,(ulong)local_318._M_dataplus._M_p);
      }
      if (iVar9 <= (int)local_290._M_string_length) {
        ::std::__cxx11::string::append((char *)&local_290);
      }
      *(long *)((long)&lStack_198 + *(long *)(local_1a8[0] + -0x18)) = (long)iVar9;
      *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
           *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffff4f | 0x20;
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,local_290._M_dataplus._M_p,
                 CONCAT44(local_290._M_string_length._4_4_,(int)local_290._M_string_length));
    }
    if (local_2b0._M_string_length != 0) {
      ::std::__cxx11::stringbuf::str();
      paVar3 = &local_270.field_2;
      uVar2 = (this->super_FormatterBase).column_width_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != paVar3) {
        operator_delete(local_270._M_dataplus._M_p);
      }
      if (uVar2 < local_270._M_string_length) {
        local_270._M_dataplus._M_p._0_1_ = 10;
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,(char *)&local_270,1);
      }
      sVar4 = (this->super_FormatterBase).right_column_width_;
      local_270._M_dataplus._M_p = (pointer)paVar3;
      ::std::__cxx11::string::_M_construct
                ((ulong)&local_270,(char)(this->super_FormatterBase).column_width_);
      detail::streamOutAsParagraph
                ((ostream *)local_1a8,&local_2b0,sVar4,&local_270,
                 local_270._M_string_length <= uVar2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != paVar3) {
        operator_delete(local_270._M_dataplus._M_p);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      operator_delete(local_290._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
      operator_delete(local_2f8._M_dataplus._M_p);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_238);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_218);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_250);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_dataplus._M_p == &local_318.field_2) goto LAB_0010f761;
  }
  else {
    (*(this->super_FormatterBase)._vptr_FormatterBase[0xc])(&local_2b0,this,opt,1);
    plVar6 = (long *)::std::__cxx11::string::replace((ulong)&local_2b0,0,(char *)0x0,0x131008);
    paVar3 = &local_318.field_2;
    puVar8 = (ulong *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar8) {
      local_318.field_2._M_allocated_capacity = *puVar8;
      local_318.field_2._8_4_ = (undefined4)plVar6[3];
      local_318.field_2._12_4_ = *(undefined4 *)((long)plVar6 + 0x1c);
      local_318._M_dataplus._M_p = (pointer)paVar3;
    }
    else {
      local_318.field_2._M_allocated_capacity = *puVar8;
      local_318._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_318._M_string_length = plVar6[1];
    *plVar6 = (long)puVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    (*(this->super_FormatterBase)._vptr_FormatterBase[0xd])(&local_2f8,this,opt);
    uVar2 = CONCAT44(local_2f8._M_string_length._4_4_,(int)local_2f8._M_string_length) +
            local_318._M_string_length;
    uVar10 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_dataplus._M_p != paVar3) {
      uVar10 = local_318.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar10 < uVar2) {
      uVar10 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
        uVar10 = local_2f8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar10 < uVar2) goto LAB_0010f386;
      puVar7 = (undefined8 *)
               ::std::__cxx11::string::replace
                         ((ulong)&local_2f8,0,(char *)0x0,(ulong)local_318._M_dataplus._M_p);
    }
    else {
LAB_0010f386:
      puVar7 = (undefined8 *)
               ::std::__cxx11::string::_M_append
                         ((char *)&local_318,(ulong)local_2f8._M_dataplus._M_p);
    }
    local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
    psVar1 = puVar7 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar1) {
      local_2d8.field_2._M_allocated_capacity = *psVar1;
      local_2d8.field_2._8_8_ = puVar7[3];
    }
    else {
      local_2d8.field_2._M_allocated_capacity = *psVar1;
      local_2d8._M_dataplus._M_p = (pointer)*puVar7;
    }
    local_2d8._M_string_length = puVar7[1];
    *puVar7 = psVar1;
    puVar7[1] = 0;
    *(undefined1 *)psVar1 = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
      operator_delete(local_2f8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_dataplus._M_p != paVar3) {
      operator_delete(local_318._M_dataplus._M_p);
    }
    paVar3 = &local_2b0.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != paVar3) {
      operator_delete(local_2b0._M_dataplus._M_p);
    }
    (*(this->super_FormatterBase)._vptr_FormatterBase[0xe])(&local_318,this,opt);
    *(long *)((long)&lStack_198 + *(long *)(local_1a8[0] + -0x18)) =
         (long)(int)(this->super_FormatterBase).column_width_;
    *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
         *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffff4f | 0x20;
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,local_2d8._M_dataplus._M_p,local_2d8._M_string_length);
    sVar5 = local_2d8._M_string_length;
    if (local_318._M_string_length != 0) {
      uVar2 = (this->super_FormatterBase).column_width_;
      local_2b8 = __return_storage_ptr__;
      if (uVar2 <= local_2d8._M_string_length) {
        local_2b0._M_dataplus._M_p._0_1_ = 10;
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,(char *)&local_2b0,1);
      }
      sVar4 = (this->super_FormatterBase).right_column_width_;
      local_2b0._M_dataplus._M_p = (pointer)paVar3;
      ::std::__cxx11::string::_M_construct
                ((ulong)&local_2b0,(char)(this->super_FormatterBase).column_width_);
      detail::streamOutAsParagraph((ostream *)local_1a8,&local_318,sVar4,&local_2b0,sVar5 < uVar2);
      __return_storage_ptr__ = local_2b8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != paVar3) {
        operator_delete(local_2b0._M_dataplus._M_p);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_dataplus._M_p == &local_318.field_2) goto LAB_0010f761;
  }
  operator_delete(local_318._M_dataplus._M_p);
LAB_0010f761:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p);
  }
  local_2d8._M_dataplus._M_p._0_1_ = 10;
  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,(char *)&local_2d8,1);
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream((stringstream *)(local_1c8 + 0x10));
  ::std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

CLI11_INLINE std::string Formatter::make_option(const Option *opt, bool is_positional) const {
    std::stringstream out;
    if(is_positional) {
        const std::string left = "  " + make_option_name(opt, true) + make_option_opts(opt);
        const std::string desc = make_option_desc(opt);
        out << std::setw(static_cast<int>(column_width_)) << std::left << left;

        if(!desc.empty()) {
            bool skipFirstLinePrefix = true;
            if(left.length() >= column_width_) {
                out << '\n';
                skipFirstLinePrefix = false;
            }
            detail::streamOutAsParagraph(
                out, desc, right_column_width_, std::string(column_width_, ' '), skipFirstLinePrefix);
        }
    } else {
        const std::string namesCombined = make_option_name(opt, false);
        const std::string opts = make_option_opts(opt);
        const std::string desc = make_option_desc(opt);

        // Split all names at comma and sort them into short names and long names
        const auto names = detail::split(namesCombined, ',');
        std::vector<std::string> vshortNames;
        std::vector<std::string> vlongNames;
        std::for_each(names.begin(), names.end(), [&vshortNames, &vlongNames](const std::string &name) {
            if(name.find("--", 0) != std::string::npos)
                vlongNames.push_back(name);
            else
                vshortNames.push_back(name);
        });

        // Assemble short and long names
        std::string shortNames = detail::join(vshortNames, ", ");
        std::string longNames = detail::join(vlongNames, ", ");

        // Calculate setw sizes
        const auto shortNamesColumnWidth = static_cast<int>(column_width_ / 3);  // 33% left for short names
        const auto longNamesColumnWidth = static_cast<int>(std::ceil(
            static_cast<float>(column_width_) / 3.0f * 2.0f));  // 66% right for long names and options, ceil result
        int shortNamesOverSize = 0;

        // Print short names
        if(!shortNames.empty()) {
            shortNames = "  " + shortNames;  // Indent
            if(longNames.empty() && !opts.empty())
                shortNames += opts;  // Add opts if only short names and no long names
            if(!longNames.empty())
                shortNames += ",";
            if(static_cast<int>(shortNames.length()) >= shortNamesColumnWidth) {
                shortNames += " ";
                shortNamesOverSize = static_cast<int>(shortNames.length()) - shortNamesColumnWidth;
            }
            out << std::setw(shortNamesColumnWidth) << std::left << shortNames;
        } else {
            out << std::setw(shortNamesColumnWidth) << std::left << "";
        }

        // Adjust long name column width in case of short names column reaching into long names column
        shortNamesOverSize =
            (std::min)(shortNamesOverSize, longNamesColumnWidth);  // Prevent negative result with unsigned integers
        const auto adjustedLongNamesColumnWidth = longNamesColumnWidth - shortNamesOverSize;

        // Print long names
        if(!longNames.empty()) {
            if(!opts.empty())
                longNames += opts;
            if(static_cast<int>(longNames.length()) >= adjustedLongNamesColumnWidth)
                longNames += " ";

            out << std::setw(adjustedLongNamesColumnWidth) << std::left << longNames;
        } else {
            out << std::setw(adjustedLongNamesColumnWidth) << std::left << "";
        }

        if(!desc.empty()) {
            bool skipFirstLinePrefix = true;
            if(out.str().length() > column_width_) {
                out << '\n';
                skipFirstLinePrefix = false;
            }
            detail::streamOutAsParagraph(
                out, desc, right_column_width_, std::string(column_width_, ' '), skipFirstLinePrefix);
        }
    }

    out << '\n';
    return out.str();
}